

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

QList<QSslCertificate> * QSslCertificate::fromData(QByteArray *data,EncodingFormat format)

{
  bool bVar1;
  QTlsBackend *pQVar2;
  QLoggingCategory *cat;
  int in_EDX;
  undefined8 in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  X509PemReaderPtr reader;
  QTlsBackend *tlsBackend;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff58;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *file;
  QMessageLogger *in_stack_ffffffffffffff70;
  QLoggingCategory *this;
  char local_68 [32];
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  pQVar2 = QTlsBackend::activeOrAnyBackend();
  if (pQVar2 == (QTlsBackend *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_RDI,in_stack_ffffffffffffff58);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x26e810);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff70,(char *)file,(int)((ulong)in_RDI >> 0x20),
                 (char *)in_stack_ffffffffffffff58,(char *)0x26e826);
      QMessageLogger::warning(local_48);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    memset(in_RDI,0,0x18);
    QList<QSslCertificate>::QList((QList<QSslCertificate> *)0x26e85e);
  }
  else {
    if (in_EDX == 0) {
      cat = (QLoggingCategory *)(**(code **)(*(long *)pQVar2 + 0xe8))();
    }
    else {
      cat = (QLoggingCategory *)(**(code **)(*(long *)pQVar2 + 0xf0))();
    }
    if (cat == (QLoggingCategory *)0x0) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      this = cat;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(in_RDI,cat);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar1) break;
        anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x26e8f8);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this,(char *)file,(int)((ulong)in_RDI >> 0x20),(char *)cat,
                   (char *)0x26e90e);
        QMessageLogger::warning(local_68);
        local_20 = local_20 & 0xffffffffffffff00;
      }
      memset(in_RDI,0,0x18);
      QList<QSslCertificate>::QList((QList<QSslCertificate> *)0x26e946);
    }
    else {
      (*(code *)cat)(in_RDI,in_RSI,0xffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QSslCertificate> *)file;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificate> QSslCertificate::fromData(const QByteArray &data, QSsl::EncodingFormat format)
{
    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return {};
    }

    auto reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
    if (!reader) {
        qCWarning(lcSsl, "The available TLS backend does not support reading PEM/DER");
        return {};
    }

    return reader(data, -1);
}